

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O1

int MAFSA_automaton_val_to_int_pair(MAFSA_letter *l,size_t sz_l,MAFSA_letter delim,int *out)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  byte *pbVar4;
  int iVar5;
  byte bVar6;
  uint uVar7;
  
  uVar7 = (uint)sz_l;
  iVar5 = -1;
  if (-1 < (int)(uVar7 - 1)) {
    bVar6 = l[uVar7 - 1];
    iVar5 = 0;
    if (bVar6 == delim) {
      uVar2 = uVar7 - 2;
      iVar3 = 0;
    }
    else {
      iVar3 = 0;
      do {
        iVar1 = (int)sz_l;
        uVar7 = iVar1 - 1;
        if ((int)uVar7 < 1) {
          return -1;
        }
        iVar3 = (uint)bVar6 + iVar3 * (uint)delim;
        bVar6 = l[iVar1 - 2];
        sz_l = (size_t)uVar7;
      } while (bVar6 != delim);
      uVar2 = iVar1 - 3;
    }
    out[1] = iVar3;
    if (-1 < (int)(uVar7 - 2)) {
      iVar3 = uVar2 + 1;
      pbVar4 = l + uVar2;
      iVar5 = 0;
      do {
        iVar5 = iVar5 * (uint)delim + (uint)*pbVar4;
        iVar3 = iVar3 + -1;
        pbVar4 = pbVar4 + -1;
      } while (0 < iVar3);
    }
    *out = iVar5;
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

extern int MAFSA_automaton_val_to_int_pair(const MAFSA_letter *l,
    size_t sz_l, MAFSA_letter delim, int *out)
{
    int i;
    int count;
    int valid = 0;

    for (i = sz_l - 1, count = 0; i >= 0; --i)
    {
        if (delim == l[i])
        {
            valid = 1;
            break;
        }

        count *= delim;
        count += l[i];
    }

    if (0 == valid)
    {
        return -1;
    }

    out[1] = count;

    for (--i, count = 0; i >= 0; --i)
    {
        count *= delim;
        count += l[i];
    }

    out[0] = count;

    return 0;
}